

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

bool __thiscall Loop::CanDoFieldCopyProp(Loop *this)

{
  bool bVar1;
  uint uVar2;
  Func *this_00;
  
  if ((this->implicitCallFlags & ~ImplicitCall_External) == ImplicitCall_HasNoInfo) {
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,HostOptPhase);
    if (bVar1) {
      uVar2 = GetLoopNumber(this);
      Output::Print(L"fieldcopyprop disabled because external: loop count: %d",(ulong)uVar2);
      this_00 = GetFunc(this);
      Func::DumpFullFunctionName(this_00);
      Output::Print(L"\n");
      Output::Flush();
    }
  }
  bVar1 = GlobOpt::ImplicitCallFlagsAllowOpts(this);
  return bVar1;
}

Assistant:

bool
Loop::CanDoFieldCopyProp()
{
#if DBG_DUMP
    if (((this->implicitCallFlags & ~(Js::ImplicitCall_External)) == 0) &&
        Js::Configuration::Global.flags.Trace.IsEnabled(Js::HostOptPhase))
    {
        Output::Print(_u("fieldcopyprop disabled because external: loop count: %d"), GetLoopNumber());
        GetFunc()->DumpFullFunctionName();
        Output::Print(_u("\n"));
        Output::Flush();
    }
#endif
    return GlobOpt::ImplicitCallFlagsAllowOpts(this);
}